

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::addTask
          (DefaultThreadPoolProvider *this,Task *task)

{
  pointer *pppTVar1;
  element_type *peVar2;
  iterator __position;
  undefined8 uVar3;
  int iVar4;
  mutex *__mutex;
  Task *local_20;
  
  __mutex = &((this->_data).
              super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_taskMutex;
  local_20 = task;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    peVar2 = (this->_data).
             super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    __position._M_current =
         (peVar2->_tasks).
         super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (peVar2->_tasks).
        super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<IlmThread_3_4::Task*,std::allocator<IlmThread_3_4::Task*>>::
      _M_realloc_insert<IlmThread_3_4::Task*const&>
                ((vector<IlmThread_3_4::Task*,std::allocator<IlmThread_3_4::Task*>> *)
                 &peVar2->_tasks,__position,&local_20);
    }
    else {
      *__position._M_current = task;
      pppTVar1 = &(peVar2->_tasks).
                  super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Semaphore::post(&((this->_data).
                      super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_taskSemaphore);
    return;
  }
  uVar3 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void
DefaultThreadPoolProvider::addTask (Task* task)
{
    // the thread pool will kill us and switch to a null provider
    // if the thread count is set to 0, so we can always
    // go ahead and lock and assume we have a thread to do the
    // processing
    {
        std::lock_guard<std::mutex> taskLock (_data->_taskMutex);

        //
        // Push the new task into the FIFO
        //
        _data->_tasks.push_back (task);
    }

    //
    // Signal that we have a new task to process
    //
    _data->_taskSemaphore.post ();
}